

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash_test_target.cc
# Opt level: O2

void __thiscall
highwayhash::HighwayHashTest<1U>::operator()
          (HighwayHashTest<1U> *this,HHKey *key,char *bytes,size_t size,HHResult64 *expected,
          HHNotify notify)

{
  unsigned_long actual;
  HHStateT<1U> state;
  HHResult64 HStack_b8;
  HHStatePortable local_b0;
  
  Portable::HHStatePortable::Reset(&local_b0,*key);
  HighwayHashT<highwayhash::Portable::HHStatePortable,unsigned_long>
            (&local_b0,bytes,size,&HStack_b8);
  anon_unknown_5::NotifyIfUnequal(size,expected,&HStack_b8,notify);
  return;
}

Assistant:

void HighwayHashTest<Target>::operator()(const HHKey& key,
                                         const char* HH_RESTRICT bytes,
                                         const size_t size,
                                         const HHResult64* expected,
                                         const HHNotify notify) const {
  HHStateT<Target> state(key);
  TestHighwayHash(&state, bytes, size, expected, notify);
}